

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O1

void __thiscall QVariant::save(QVariant *this,QDataStream *s)

{
  undefined1 *puVar1;
  int iVar2;
  ulong uVar3;
  PrivateShared *pPVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  char *s_00;
  QMetaTypeInterface *iface;
  uint i;
  long in_FS_OFFSET;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iface = (QMetaTypeInterface *)(*(ulong *)&(this->d).field_0x18 & 0xfffffffffffffffc);
  if (iface == (QMetaTypeInterface *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (iface->typeId)._q_value.super___atomic_base<int>._M_i;
    if (uVar6 == 0) {
      uVar6 = QMetaType::registerHelper(iface);
    }
  }
  puVar1 = &(this->d).field_0x18;
  bVar9 = 0xffff < uVar6;
  uVar5 = 0x10000;
  if (!bVar9) {
    uVar5 = uVar6;
  }
  iVar2 = s->ver;
  i = uVar5;
  if (iVar2 < 0x14) {
    if (uVar6 < 0x10000) {
      if ((uVar5 & 0x1fff8) == 0x38) {
        bVar9 = true;
        i = 0x400;
      }
      else if (uVar5 - 0x1000 < 0x18) {
        i = uVar5 - 0xfc0;
      }
      else {
        i = 0x79;
        if (uVar5 != 0x2000) {
          i = uVar5;
        }
      }
    }
    else {
      iVar7 = strcmp(*(char **)((*(ulong *)puVar1 & 0xfffffffffffffffc) + 0x18),"QRegExp");
      i = 0x400;
      if (iVar7 == 0) {
        i = 0x1b;
      }
    }
  }
  if (iVar2 < 7) {
    if (i == 0) {
      i = 0;
      bVar10 = true;
    }
    else {
      uVar3 = 0;
      do {
        uVar8 = uVar3;
        bVar10 = uVar8 < 0x23;
        if (uVar8 == 0x23) goto LAB_002d38e0;
        uVar3 = uVar8 + 1;
      } while (i != mapIdFromQt3ToCurrent[uVar8 + 1]);
      bVar10 = uVar8 < 0x23;
      i = (uint)(uVar8 + 1);
    }
LAB_002d38e0:
    if (!bVar10) {
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      local_40 = 2;
      save((QVariant *)&local_58,s);
      ~QVariant((QVariant *)&local_58);
      goto LAB_002d39f8;
    }
  }
  else if (iVar2 < 0xd) {
    if (i == 0x400) {
      i = 0x7f;
      bVar9 = true;
    }
    else if (i - 0x1f < 0x19) {
      i = i + 0x61;
    }
    else if (i == 0x79) {
      i = 0x4b;
    }
    else if (i - 0x4b < 0xb) {
      i = i + 1;
    }
    else {
      bVar10 = 0x55 < i;
      bVar11 = i == 0x1e;
      uVar6 = 0x7f;
      if (!bVar11 && !bVar10) {
        uVar6 = i;
      }
      i = uVar6;
      bVar9 = (bool)(bVar9 | (bVar11 || bVar10));
    }
  }
  if (bVar9) {
    if (s->ver < 0x14) {
      s_00 = QtMetaTypePrivate::typedefNameForType
                       ((QMetaTypeInterface *)(*(ulong *)puVar1 & 0xfffffffffffffffc));
    }
    else {
      s_00 = (char *)0x0;
    }
    if (s_00 == (char *)0x0) {
      if ((*(ulong *)puVar1 & 0xfffffffffffffffc) == 0) goto LAB_002d3945;
      s_00 = *(char **)((*(ulong *)puVar1 & 0xfffffffffffffffc) + 0x18);
    }
  }
  else {
LAB_002d3945:
    s_00 = (char *)0x0;
  }
  QDataStream::operator<<(s,i);
  if (7 < s->ver) {
    QDataStream::operator<<(s,(byte)*puVar1 >> 1 & 1);
  }
  if (s_00 != (char *)0x0) {
    QDataStream::operator<<(s,s_00);
  }
  uVar3 = *(ulong *)puVar1;
  if (uVar3 < 4) {
    if (s->ver < 0xd) {
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      ::operator<<(s,(QString *)&local_58);
      if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_58.shared)->ref)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_58.shared)->ref)->_q_value).super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_58.shared)->ref)->_q_value).super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
        }
      }
    }
  }
  else {
    local_58.shared = (PrivateShared *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pPVar4 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar4->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar4->offset);
    }
    bVar9 = QMetaType::save((QMetaType *)&local_58.shared,s,this);
    if (!bVar9) {
      save();
    }
  }
LAB_002d39f8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QVariant::save(QDataStream &s) const
{
    quint32 typeId = d.type().id();
    bool saveAsUserType = false;
    if (typeId >= QMetaType::User) {
        typeId = QMetaType::User;
        saveAsUserType = true;
    }
    if (s.version() < QDataStream::Qt_6_0) {
        // map to Qt 5 values
        if (typeId == QMetaType::User) {
            typeId = Qt5UserType;
            if (!strcmp(d.type().name(), "QRegExp")) {
                typeId = 27; // QRegExp in Qt 4/5
            }
        } else if (typeId > Qt5LastCoreType && typeId <= QMetaType::LastCoreType) {
            // the type didn't exist in Qt 5
            typeId = Qt5UserType;
            saveAsUserType = true;
        } else if (typeId >= QMetaType::FirstGuiType && typeId <= QMetaType::LastGuiType) {
            typeId -= Qt6ToQt5GuiTypeDelta;
            if (typeId > Qt5LastGuiType) {
                typeId = Qt5UserType;
                saveAsUserType = true;
            }
        } else if (typeId == QMetaType::QSizePolicy) {
            typeId = Qt5SizePolicy;
        }
    }
    if (s.version() < QDataStream::Qt_4_0) {
        int i;
        for (i = 0; i <= MapFromThreeCount - 1; ++i) {
            if (mapIdFromQt3ToCurrent[i] == typeId) {
                typeId = i;
                break;
            }
        }
        if (i >= MapFromThreeCount) {
            s << QVariant();
            return;
        }
    } else if (s.version() < QDataStream::Qt_5_0) {
        if (typeId == Qt5UserType) {
            typeId = 127; // QVariant::UserType had this value in Qt4
            saveAsUserType = true;
        } else if (typeId >= 128 - 97 && typeId <= Qt5LastCoreType) {
            // In Qt4 id == 128 was FirstExtCoreType. In Qt5 ExtCoreTypes set was merged to CoreTypes
            // by moving all ids down by 97.
            typeId += 97;
        } else if (typeId == Qt5SizePolicy) {
            typeId = 75;
        } else if (typeId >= Qt5KeySequence && typeId <= Qt5QQuaternion) {
            // and as a result these types received lower ids too
            typeId += 1;
        } else if (typeId > Qt5QQuaternion || typeId == QMetaType::QUuid) {
            // These existed in Qt 4 only as a custom type
            typeId = 127;
            saveAsUserType = true;
        }
    }
    const char *typeName = nullptr;
    if (saveAsUserType) {
        if (s.version() < QDataStream::Qt_6_0)
            typeName = QtMetaTypePrivate::typedefNameForType(d.type().d_ptr);
        if (!typeName)
            typeName = d.type().name();
    }
    s << typeId;
    if (s.version() >= QDataStream::Qt_4_2)
        s << qint8(d.is_null);
    if (typeName)
        s << typeName;

    if (!isValid()) {
        if (s.version() < QDataStream::Qt_5_0)
            s << QString();
        return;
    }

    if (!d.type().save(s, constData())) {
        qWarning("QVariant::save: unable to save type '%s' (type id: %d).\n",
                 d.type().name(), d.type().id());
        Q_ASSERT_X(false, "QVariant::save", "Invalid type to save");
    }
}